

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O1

void google::protobuf::internal::ZeroFieldsBase::CopyImpl(Message *to_param,Message *from_param)

{
  InternalMetadata *this;
  ulong uVar1;
  
  if (from_param != to_param) {
    this = &(to_param->super_MessageLite)._internal_metadata_;
    if (((to_param->super_MessageLite)._internal_metadata_.ptr_ & 1) != 0) {
      InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>(this);
    }
    uVar1 = (from_param->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 1) != 0) {
      InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
                (this,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
      return;
    }
  }
  return;
}

Assistant:

void ZeroFieldsBase::CopyImpl(Message& to_param, const Message& from_param) {
  auto* to = static_cast<ZeroFieldsBase*>(&to_param);
  const auto* from = static_cast<const ZeroFieldsBase*>(&from_param);
  if (from == to) return;
  to->_internal_metadata_.Clear<UnknownFieldSet>();
  to->_internal_metadata_.MergeFrom<UnknownFieldSet>(from->_internal_metadata_);
}